

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O1

Vec_Ptr_t * Gia_ManTerTranspose(Gia_ManTer_t *p)

{
  uint uVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  void *pvVar6;
  byte bVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  pVVar4->pArray = ppvVar5;
  if (0 < p->pAig->nRegs) {
    uVar1 = p->vStates->nSize;
    uVar11 = 0;
    do {
      if ((p->pCount0[uVar11] != p->vStates->nSize) && (p->pCountX[uVar11] < 1)) {
        pvVar6 = calloc((long)(int)((((int)uVar1 >> 4) + 1) - (uint)((uVar1 & 0xf) == 0)) * 4 + 8,1)
        ;
        uVar9 = pVVar4->nSize;
        uVar2 = pVVar4->nCap;
        if (uVar9 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
            }
            iVar12 = 0x10;
          }
          else {
            iVar12 = uVar2 * 2;
            if (iVar12 <= (int)uVar2) goto LAB_0023d110;
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar4->pArray,(ulong)uVar2 << 4);
            }
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = iVar12;
        }
LAB_0023d110:
        pVVar4->nSize = uVar9 + 1;
        pVVar4->pArray[(int)uVar9] = pvVar6;
        pVVar3 = p->vStates;
        if (0 < pVVar3->nSize) {
          ppvVar5 = pVVar3->pArray;
          bVar7 = 0;
          uVar8 = 0;
          do {
            uVar9 = *(uint *)((long)ppvVar5[uVar8] + (uVar11 >> 4 & 0xfffffff) * 4) >>
                    ((char)uVar11 * '\x02' & 0x1eU);
            if ((uVar9 & 3) == 0) {
              __assert_fail("Value >= GIA_ZER && Value <= GIA_UND",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTsim.c"
                            ,0x24,"void Gia_ManTerSimInfoSet(unsigned int *, int, int)");
            }
            uVar10 = uVar8 >> 4 & 0xfffffff;
            uVar2 = *(uint *)((long)pvVar6 + uVar10 * 4);
            *(uint *)((long)pvVar6 + uVar10 * 4) =
                 ((uVar2 >> (bVar7 & 0x1e) ^ uVar9) & 3) << (bVar7 & 0x1e) ^ uVar2;
            uVar8 = uVar8 + 1;
            bVar7 = bVar7 + 2;
          } while ((long)uVar8 < (long)pVVar3->nSize);
        }
      }
      uVar11 = uVar11 + 1;
    } while ((long)uVar11 < (long)p->pAig->nRegs);
  }
  return pVVar4;
}

Assistant:

Vec_Ptr_t * Gia_ManTerTranspose( Gia_ManTer_t * p )
{
    Vec_Ptr_t * vFlops;
    unsigned * pState, * pFlop;
    int i, k, nFlopWords;
    vFlops = Vec_PtrAlloc( 100 );
    nFlopWords = Abc_BitWordNum( 2*Vec_PtrSize(p->vStates) );
    for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
    {
        if ( p->pCount0[i] == Vec_PtrSize(p->vStates) ) 
            continue;
        if ( p->pCountX[i] > 0 )
            continue;
        pFlop = Gia_ManTerStateAlloc( nFlopWords );
        Vec_PtrPush( vFlops, pFlop );
        Vec_PtrForEachEntry( unsigned *, p->vStates, pState, k )
            Gia_ManTerSimInfoSet( pFlop, k, Gia_ManTerSimInfoGet(pState, i) );
//Gia_ManTerStatePrint( pFlop, Vec_PtrSize(p->vStates), i );
    }
    return vFlops;
}